

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astContinueNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  sysbvm_stackFrameRecord_t *targetRecord;
  sysbvm_tuple_t continueTarget;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_astContinueNode_t **continueNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  continueTarget = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sourcePositionRecord.sourcePosition = (sysbvm_tuple_t)arguments;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&continueTarget);
  tuple = sysbvm_environment_lookContinueTargetRecursively(context,arguments[1]);
  if (tuple == 0) {
    sysbvm_error("No target available for continue.");
  }
  targetRecord = (sysbvm_stackFrameRecord_t *)sysbvm_tuple_uintptr_decode(tuple);
  sysbvm_stackFrame_continueInto(targetRecord);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astContinueNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astContinueNode_t **continueNode = (sysbvm_astContinueNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*continueNode)->super.sourcePosition);

    sysbvm_tuple_t continueTarget = sysbvm_environment_lookContinueTargetRecursively(context, *environment);
    if(!continueTarget)
        sysbvm_error("No target available for continue.");

    sysbvm_stackFrame_continueInto((sysbvm_stackFrameRecord_t*)sysbvm_tuple_uintptr_decode(continueTarget));
    return SYSBVM_NULL_TUPLE;
}